

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

ComponentHandle<Tag,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Tag,Tag_const&>(EntityManager *this,Id id,Tag *args)

{
  ComponentHandle<Tag,_entityx::EntityManager> CVar1;
  Pool<Tag,_8192UL> *pPVar2;
  vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *this_00;
  char *pcVar3;
  int __c;
  int __c_00;
  char *in_RDX;
  Id in_RSI;
  EntityManager *in_RDI;
  EventManager *unaff_retaddr;
  Pool<Tag,_8192UL> *pool;
  Family family;
  ComponentHandle<Tag,_entityx::EntityManager> component;
  Tag *this_01;
  undefined1 __val;
  size_t in_stack_ffffffffffffff78;
  Entity local_58;
  uint64_t local_48;
  EntityManager *in_stack_ffffffffffffffc0;
  Id local_18;
  ComponentHandle<Tag,_entityx::EntityManager> *in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  
  local_18.id_ = in_RSI.id_;
  assert_valid(in_RDI,in_RSI);
  component_family<Tag>();
  pPVar2 = accomodate_component<Tag>(in_stack_ffffffffffffffc0);
  this_01 = (Tag *)&local_18;
  Entity::Id::index((Id *)this_01,(char *)in_RSI.id_,__c);
  BasePool::get((BasePool *)in_RDI,in_stack_ffffffffffffff78);
  Tag::Tag(this_01,(Tag *)pPVar2);
  this_00 = (vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)
            ((BasePool *)in_RDI + 0x48);
  pcVar3 = Entity::Id::index((Id *)this_01,in_RDX,__c_00);
  __val = (undefined1)((ulong)this_01 >> 0x38);
  Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
            (this_00,(ulong)pcVar3 & 0xffffffff);
  Catch::clara::std::bitset<64UL>::set((bitset<64UL> *)in_RDI,(size_t)this_00,(bool)__val);
  local_48 = local_18.id_;
  ComponentHandle<Tag,_entityx::EntityManager>::ComponentHandle
            ((ComponentHandle<Tag,_entityx::EntityManager> *)&stack0xfffffffffffffff0,in_RDI,
             local_18);
  Entity::Entity(&local_58,in_RDI,local_18);
  EventManager::
  emit<entityx::ComponentAddedEvent<Tag>,entityx::Entity,entityx::ComponentHandle<Tag,entityx::EntityManager>&>
            (unaff_retaddr,(Entity *)in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  CVar1.id_.id_ = in_stack_fffffffffffffff8;
  CVar1.manager_ = (EntityManager *)in_stack_fffffffffffffff0;
  return CVar1;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }